

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pubkey.c
# Opt level: O0

DSA * d2i_DSA_PUBKEY(DSA **a,uchar **pp,long length)

{
  uchar *puVar1;
  EVP_PKEY *pkey_00;
  uchar *q;
  DSA *key;
  EVP_PKEY *pkey;
  uchar **in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  puVar1 = *pp;
  pkey_00 = ossl_d2i_PUBKEY_legacy((EVP_PKEY **)length,in_stack_ffffffffffffffd8,0);
  if (pkey_00 == (EVP_PKEY *)0x0) {
    local_8 = (dsa_st *)0x0;
  }
  else {
    local_8 = EVP_PKEY_get1_DSA((EVP_PKEY *)pkey_00);
    EVP_PKEY_free((EVP_PKEY *)pkey_00);
    if (local_8 == (dsa_st *)0x0) {
      local_8 = (dsa_st *)0x0;
    }
    else {
      *pp = puVar1;
      if (a != (DSA **)0x0) {
        DSA_free(*a);
        *a = local_8;
      }
    }
  }
  return local_8;
}

Assistant:

DSA *d2i_DSA_PUBKEY(DSA **a, const unsigned char **pp, long length)
{
    EVP_PKEY *pkey;
    DSA *key = NULL;
    const unsigned char *q;

    q = *pp;
    pkey = ossl_d2i_PUBKEY_legacy(NULL, &q, length);
    if (pkey == NULL)
        return NULL;
    key = EVP_PKEY_get1_DSA(pkey);
    EVP_PKEY_free(pkey);
    if (key == NULL)
        return NULL;
    *pp = q;
    if (a != NULL) {
        DSA_free(*a);
        *a = key;
    }
    return key;
}